

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O1

QShaderDescriptionPrivate * __thiscall
QShaderDescriptionPrivate::makeDoc(QShaderDescriptionPrivate *this)

{
  long lVar1;
  Int IVar2;
  char cVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  char *pcVar10;
  char *pcVar11;
  InOutVariable *v;
  InOutVariable *pIVar12;
  long in_RSI;
  long lVar13;
  BlockVariable *v_4;
  long lVar14;
  InOutVariable *pIVar15;
  BlockVariable *v_2;
  StorageBlock *b_2;
  long in_FS_OFFSET;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QByteArrayView QVar18;
  QLatin1String QVar19;
  QByteArrayView QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  QLatin1String QVar25;
  QLatin1String QVar26;
  QByteArrayView QVar27;
  QLatin1String QVar28;
  QLatin1String QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QByteArrayView QVar32;
  QLatin1String QVar33;
  QByteArrayView QVar34;
  QLatin1String QVar35;
  QLatin1String QVar36;
  QLatin1String QVar37;
  QLatin1String QVar38;
  QLatin1String QVar39;
  QLatin1String QVar40;
  QLatin1String QVar41;
  QLatin1String QVar42;
  QByteArrayView QVar43;
  QLatin1String QVar44;
  QLatin1String QVar45;
  QLatin1String QVar46;
  QByteArrayView QVar47;
  QLatin1String QVar48;
  QLatin1String QVar49;
  QLatin1String QVar50;
  QLatin1String QVar51;
  QLatin1String QVar52;
  QLatin1String QVar53;
  QLatin1String QVar54;
  QLatin1String QVar55;
  QLatin1String QVar56;
  QLatin1String QVar57;
  QByteArrayView QVar58;
  QLatin1String QVar59;
  QLatin1String QVar60;
  QLatin1String QVar61;
  QByteArrayView QVar62;
  QLatin1String QVar63;
  QLatin1String QVar64;
  QLatin1String QVar65;
  undefined1 auVar66 [16];
  QLatin1String QVar67;
  QLatin1String QVar68;
  QLatin1String QVar69;
  QLatin1String QVar70;
  QLatin1String QVar71;
  QLatin1String QVar72;
  QLatin1String QVar73;
  QJsonObject sampler_1;
  QJsonArray jseparateSamplers;
  QJsonArray jseparateImages;
  QJsonArray joutBuiltins;
  QJsonArray jinBuiltins;
  QJsonArray jstorageImages;
  QJsonArray jcombinedSamplers;
  QJsonArray jstorageBlocks;
  QJsonArray members;
  QJsonArray jpushConstantBlocks;
  QJsonArray juniformBlocks;
  QJsonArray joutputs;
  QJsonArray jinputs;
  QJsonObject root;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [24];
  undefined1 *local_78;
  undefined1 *local_70;
  Data *local_68;
  Data *local_60;
  int *local_58;
  QJsonValue local_50 [24];
  BlockVariable *local_38;
  
  local_38 = *(BlockVariable **)(in_FS_OFFSET + 0x28);
  local_58 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)&local_58);
  local_60 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_60);
  if (*(long *)(in_RSI + 0x18) != 0) {
    lVar14 = *(long *)(in_RSI + 0x18) * 0x68;
    do {
      inOutObject((InOutVariable *)local_90);
      QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
      QJsonArray::append((QJsonValue *)&local_60);
      QJsonValue::~QJsonValue(local_50);
      QJsonObject::~QJsonObject((QJsonObject *)local_90);
      lVar14 = lVar14 + -0x68;
    } while (lVar14 != 0);
  }
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue(local_50,(QJsonArray *)&local_60);
    QVar16.m_data = &DAT_00000006;
    QVar16.m_size = (qsizetype)&local_58;
    local_90._0_16_ = QJsonObject::operator[](QVar16);
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  local_68 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_68);
  if (*(long *)(in_RSI + 0x30) != 0) {
    lVar14 = *(long *)(in_RSI + 0x30) * 0x68;
    do {
      inOutObject((InOutVariable *)local_90);
      QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
      QJsonArray::append((QJsonValue *)&local_68);
      QJsonValue::~QJsonValue(local_50);
      QJsonObject::~QJsonObject((QJsonObject *)local_90);
      lVar14 = lVar14 + -0x68;
    } while (lVar14 != 0);
  }
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue(local_50,(QJsonArray *)&local_68);
    QVar17.m_data = (char *)0x7;
    QVar17.m_size = (qsizetype)&local_58;
    auVar66 = QJsonObject::operator[](QVar17);
    local_90._0_16_ = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_70);
  iVar4 = QList<QShaderDescription::UniformBlock>::begin
                    ((QList<QShaderDescription::UniformBlock> *)(in_RSI + 0x38));
  iVar5 = QList<QShaderDescription::UniformBlock>::end
                    ((QList<QShaderDescription::UniformBlock> *)(in_RSI + 0x38));
  if (iVar4.i != iVar5.i) {
    do {
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      QJsonObject::QJsonObject((QJsonObject *)&local_78);
      QVar18.m_data = (storage_type *)((iVar4.i)->blockName).d.size;
      QVar18.m_size = (qsizetype)local_90;
      QString::fromUtf8(QVar18);
      QJsonValue::QJsonValue(local_50,(QString *)local_90);
      QVar19.m_data = (char *)0x9;
      QVar19.m_size = (qsizetype)&local_78;
      local_a0 = QJsonObject::operator[](QVar19);
      QJsonValueRef::operator=((QJsonValueRef *)local_a0,local_50);
      QJsonValue::~QJsonValue(local_50);
      if ((QArrayData *)local_90._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_90._0_8_,2,0x10);
        }
      }
      QVar20.m_data = (storage_type *)((iVar4.i)->structName).d.size;
      QVar20.m_size = (qsizetype)local_90;
      QString::fromUtf8(QVar20);
      QJsonValue::QJsonValue(local_50,(QString *)local_90);
      QVar21.m_data = (char *)0xa;
      QVar21.m_size = (qsizetype)&local_78;
      auVar66 = QJsonObject::operator[](QVar21);
      local_a0 = auVar66;
      QJsonValueRef::operator=((QJsonValueRef *)local_a0,local_50);
      QJsonValue::~QJsonValue(local_50);
      if ((QArrayData *)local_90._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_90._0_8_,2,0x10);
        }
      }
      QJsonValue::QJsonValue(local_50,(iVar4.i)->size);
      QVar22.m_data = (char *)0x4;
      QVar22.m_size = (qsizetype)&local_78;
      auVar66 = QJsonObject::operator[](QVar22);
      local_90._0_16_ = auVar66;
      QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
      QJsonValue::~QJsonValue(local_50);
      if (-1 < (iVar4.i)->binding) {
        QJsonValue::QJsonValue(local_50,(iVar4.i)->binding);
        QVar23.m_data = (char *)0x7;
        QVar23.m_size = (qsizetype)&local_78;
        auVar66 = QJsonObject::operator[](QVar23);
        local_90._0_16_ = auVar66;
        QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
        QJsonValue::~QJsonValue(local_50);
      }
      if (-1 < (iVar4.i)->descriptorSet) {
        QJsonValue::QJsonValue(local_50,(iVar4.i)->descriptorSet);
        QVar24.m_data = (char *)0x3;
        QVar24.m_size = (qsizetype)&local_78;
        auVar66 = QJsonObject::operator[](QVar24);
        local_90._0_16_ = auVar66;
        QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
        QJsonValue::~QJsonValue(local_50);
      }
      local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QJsonArray::QJsonArray((QJsonArray *)local_a0);
      lVar14 = ((iVar4.i)->members).d.size;
      if (lVar14 != 0) {
        lVar14 = lVar14 * 0x68;
        do {
          blockMemberObject((BlockVariable *)local_90);
          QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
          QJsonArray::append((QJsonValue *)local_a0);
          QJsonValue::~QJsonValue(local_50);
          QJsonObject::~QJsonObject((QJsonObject *)local_90);
          lVar14 = lVar14 + -0x68;
        } while (lVar14 != 0);
      }
      QJsonValue::QJsonValue(local_50,(QJsonArray *)local_a0);
      QVar25.m_data = (char *)0x7;
      QVar25.m_size = (qsizetype)&local_78;
      auVar66 = QJsonObject::operator[](QVar25);
      local_90._0_16_ = auVar66;
      QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
      QJsonValue::~QJsonValue(local_50);
      QJsonValue::QJsonValue(local_50,(QJsonObject *)&local_78);
      QJsonArray::append((QJsonValue *)&local_70);
      QJsonValue::~QJsonValue(local_50);
      QJsonArray::~QJsonArray((QJsonArray *)local_a0);
      QJsonObject::~QJsonObject((QJsonObject *)&local_78);
      iVar4.i = iVar4.i + 1;
    } while (iVar4.i != iVar5.i);
  }
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue(local_50,(QJsonArray *)&local_70);
    QVar26.m_data = (char *)0xd;
    QVar26.m_size = (qsizetype)&local_58;
    auVar66 = QJsonObject::operator[](QVar26);
    local_90._0_16_ = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_78);
  iVar6 = QList<QShaderDescription::PushConstantBlock>::begin
                    ((QList<QShaderDescription::PushConstantBlock> *)(in_RSI + 0x50));
  iVar7 = QList<QShaderDescription::PushConstantBlock>::end
                    ((QList<QShaderDescription::PushConstantBlock> *)(in_RSI + 0x50));
  if (iVar6.i != iVar7.i) {
    do {
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      QJsonObject::QJsonObject((QJsonObject *)&local_a8);
      QVar27.m_data = (storage_type *)((iVar6.i)->name).d.size;
      QVar27.m_size = (qsizetype)local_90;
      QString::fromUtf8(QVar27);
      QJsonValue::QJsonValue(local_50,(QString *)local_90);
      QVar28.m_data = (char *)0x4;
      QVar28.m_size = (qsizetype)&local_a8;
      local_a0 = QJsonObject::operator[](QVar28);
      QJsonValueRef::operator=((QJsonValueRef *)local_a0,local_50);
      QJsonValue::~QJsonValue(local_50);
      if ((QArrayData *)local_90._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_90._0_8_,2,0x10);
        }
      }
      QJsonValue::QJsonValue(local_50,(iVar6.i)->size);
      QVar29.m_data = (char *)0x4;
      QVar29.m_size = (qsizetype)&local_a8;
      auVar66 = QJsonObject::operator[](QVar29);
      local_90._0_16_ = auVar66;
      QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
      QJsonValue::~QJsonValue(local_50);
      local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QJsonArray::QJsonArray((QJsonArray *)local_a0);
      lVar14 = ((iVar6.i)->members).d.size;
      if (lVar14 != 0) {
        lVar14 = lVar14 * 0x68;
        do {
          blockMemberObject((BlockVariable *)local_90);
          QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
          QJsonArray::append((QJsonValue *)local_a0);
          QJsonValue::~QJsonValue(local_50);
          QJsonObject::~QJsonObject((QJsonObject *)local_90);
          lVar14 = lVar14 + -0x68;
        } while (lVar14 != 0);
      }
      QJsonValue::QJsonValue(local_50,(QJsonArray *)local_a0);
      QVar30.m_data = (char *)0x7;
      QVar30.m_size = (qsizetype)&local_a8;
      auVar66 = QJsonObject::operator[](QVar30);
      local_90._0_16_ = auVar66;
      QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
      QJsonValue::~QJsonValue(local_50);
      QJsonValue::QJsonValue(local_50,(QJsonObject *)&local_a8);
      QJsonArray::append((QJsonValue *)&local_78);
      QJsonValue::~QJsonValue(local_50);
      QJsonArray::~QJsonArray((QJsonArray *)local_a0);
      QJsonObject::~QJsonObject((QJsonObject *)&local_a8);
      iVar6.i = iVar6.i + 1;
    } while (iVar6.i != iVar7.i);
  }
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue(local_50,(QJsonArray *)&local_78);
    QVar31.m_data = (char *)0x12;
    QVar31.m_size = (qsizetype)&local_58;
    auVar66 = QJsonObject::operator[](QVar31);
    local_90._0_16_ = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_a8);
  iVar8 = QList<QShaderDescription::StorageBlock>::begin
                    ((QList<QShaderDescription::StorageBlock> *)(in_RSI + 0x68));
  iVar9 = QList<QShaderDescription::StorageBlock>::end
                    ((QList<QShaderDescription::StorageBlock> *)(in_RSI + 0x68));
  if (iVar8.i != iVar9.i) {
    do {
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      QJsonObject::QJsonObject((QJsonObject *)&local_b0);
      QVar32.m_data = (storage_type *)((iVar8.i)->blockName).d.size;
      QVar32.m_size = (qsizetype)local_90;
      QString::fromUtf8(QVar32);
      QJsonValue::QJsonValue(local_50,(QString *)local_90);
      QVar33.m_data = (char *)0x9;
      QVar33.m_size = (qsizetype)&local_b0;
      local_a0 = QJsonObject::operator[](QVar33);
      QJsonValueRef::operator=((QJsonValueRef *)local_a0,local_50);
      QJsonValue::~QJsonValue(local_50);
      if ((QArrayData *)local_90._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_90._0_8_,2,0x10);
        }
      }
      QVar34.m_data = (storage_type *)((iVar8.i)->instanceName).d.size;
      QVar34.m_size = (qsizetype)local_90;
      QString::fromUtf8(QVar34);
      QJsonValue::QJsonValue(local_50,(QString *)local_90);
      QVar35.m_data = (char *)0xc;
      QVar35.m_size = (qsizetype)&local_b0;
      auVar66 = QJsonObject::operator[](QVar35);
      local_a0 = auVar66;
      QJsonValueRef::operator=((QJsonValueRef *)local_a0,local_50);
      QJsonValue::~QJsonValue(local_50);
      if ((QArrayData *)local_90._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_90._0_8_,2,0x10);
        }
      }
      QJsonValue::QJsonValue(local_50,(iVar8.i)->knownSize);
      QVar36.m_data = (char *)0x9;
      QVar36.m_size = (qsizetype)&local_b0;
      auVar66 = QJsonObject::operator[](QVar36);
      local_90._0_16_ = auVar66;
      QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
      QJsonValue::~QJsonValue(local_50);
      if (-1 < (iVar8.i)->binding) {
        QJsonValue::QJsonValue(local_50,(iVar8.i)->binding);
        QVar37.m_data = (char *)0x7;
        QVar37.m_size = (qsizetype)&local_b0;
        auVar66 = QJsonObject::operator[](QVar37);
        local_90._0_16_ = auVar66;
        QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
        QJsonValue::~QJsonValue(local_50);
      }
      if (-1 < (iVar8.i)->descriptorSet) {
        QJsonValue::QJsonValue(local_50,(iVar8.i)->descriptorSet);
        QVar38.m_data = (char *)0x3;
        QVar38.m_size = (qsizetype)&local_b0;
        auVar66 = QJsonObject::operator[](QVar38);
        local_90._0_16_ = auVar66;
        QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
        QJsonValue::~QJsonValue(local_50);
      }
      if ((iVar8.i)->runtimeArrayStride != 0) {
        QJsonValue::QJsonValue(local_50,(iVar8.i)->runtimeArrayStride);
        QVar39.m_data = (char *)0x12;
        QVar39.m_size = (qsizetype)&local_b0;
        auVar66 = QJsonObject::operator[](QVar39);
        local_90._0_16_ = auVar66;
        QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
        QJsonValue::~QJsonValue(local_50);
      }
      IVar2 = ((iVar8.i)->qualifierFlags).
              super_QFlagsStorageHelper<QShaderDescription::QualifierFlag,_4>.
              super_QFlagsStorage<QShaderDescription::QualifierFlag>.i;
      if (IVar2 != 0) {
        QJsonValue::QJsonValue(local_50,IVar2);
        QVar40.m_data = (char *)0xe;
        QVar40.m_size = (qsizetype)&local_b0;
        auVar66 = QJsonObject::operator[](QVar40);
        local_90._0_16_ = auVar66;
        QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
        QJsonValue::~QJsonValue(local_50);
      }
      local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QJsonArray::QJsonArray((QJsonArray *)local_a0);
      lVar14 = ((iVar8.i)->members).d.size;
      if (lVar14 != 0) {
        lVar14 = lVar14 * 0x68;
        do {
          blockMemberObject((BlockVariable *)local_90);
          QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
          QJsonArray::append((QJsonValue *)local_a0);
          QJsonValue::~QJsonValue(local_50);
          QJsonObject::~QJsonObject((QJsonObject *)local_90);
          lVar14 = lVar14 + -0x68;
        } while (lVar14 != 0);
      }
      QJsonValue::QJsonValue(local_50,(QJsonArray *)local_a0);
      QVar41.m_data = (char *)0x7;
      QVar41.m_size = (qsizetype)&local_b0;
      auVar66 = QJsonObject::operator[](QVar41);
      local_90._0_16_ = auVar66;
      QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
      QJsonValue::~QJsonValue(local_50);
      QJsonValue::QJsonValue(local_50,(QJsonObject *)&local_b0);
      QJsonArray::append((QJsonValue *)&local_a8);
      QJsonValue::~QJsonValue(local_50);
      QJsonArray::~QJsonArray((QJsonArray *)local_a0);
      QJsonObject::~QJsonObject((QJsonObject *)&local_b0);
      iVar8.i = iVar8.i + 1;
    } while (iVar8.i != iVar9.i);
  }
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue(local_50,(QJsonArray *)&local_a8);
    QVar42.m_data = (char *)0xd;
    QVar42.m_size = (qsizetype)&local_58;
    auVar66 = QJsonObject::operator[](QVar42);
    local_90._0_16_ = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_b0);
  if (*(long *)(in_RSI + 0x90) != 0) {
    pIVar12 = *(InOutVariable **)(in_RSI + 0x88);
    pIVar15 = pIVar12 + *(long *)(in_RSI + 0x90);
LAB_0046e65a:
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&local_b8);
    QVar43.m_data = (storage_type *)(pIVar12->name).d.size;
    QVar43.m_size = (qsizetype)local_90;
    QString::fromUtf8(QVar43);
    QJsonValue::QJsonValue(local_50,(QString *)local_90);
    QVar44.m_data = (char *)0x4;
    QVar44.m_size = (qsizetype)&local_b8;
    auVar66 = QJsonObject::operator[](QVar44);
    local_a0 = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_a0,local_50);
    QJsonValue::~QJsonValue(local_50);
    if ((QArrayData *)local_90._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_90._0_8_,2,0x10);
      }
    }
    lVar14 = 0;
LAB_0046e6e7:
    if (*(VariableType *)(typeTab[0].k + lVar14 + 0x14) != pIVar12->type) goto code_r0x0046e6ed;
    pcVar10 = typeTab[0].k + lVar14;
    lVar13 = -1;
    do {
      lVar1 = lVar14 + lVar13;
      lVar13 = lVar13 + 1;
    } while (typeTab[0].k[lVar1 + 1] != '\0');
    goto LAB_0046e718;
  }
LAB_0046e791:
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue(local_50,(QJsonArray *)&local_b0);
    QVar46.m_data = (char *)0x15;
    QVar46.m_size = (qsizetype)&local_58;
    auVar66 = QJsonObject::operator[](QVar46);
    local_90._0_16_ = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_b8);
  if (*(long *)(in_RSI + 0xd8) != 0) {
    pIVar12 = *(InOutVariable **)(in_RSI + 0xd0);
    pIVar15 = pIVar12 + *(long *)(in_RSI + 0xd8);
LAB_0046e83f:
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&local_c0);
    QVar47.m_data = (storage_type *)(pIVar12->name).d.size;
    QVar47.m_size = (qsizetype)local_90;
    QString::fromUtf8(QVar47);
    QJsonValue::QJsonValue(local_50,(QString *)local_90);
    QVar48.m_data = (char *)0x4;
    QVar48.m_size = (qsizetype)&local_c0;
    auVar66 = QJsonObject::operator[](QVar48);
    local_a0 = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_a0,local_50);
    QJsonValue::~QJsonValue(local_50);
    if ((QArrayData *)local_90._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_90._0_8_,2,0x10);
      }
    }
    lVar14 = 0;
LAB_0046e8cc:
    if (*(VariableType *)(typeTab[0].k + lVar14 + 0x14) != pIVar12->type) goto code_r0x0046e8d2;
    pcVar10 = typeTab[0].k + lVar14;
    lVar13 = -1;
    do {
      lVar1 = lVar14 + lVar13;
      lVar13 = lVar13 + 1;
    } while (typeTab[0].k[lVar1 + 1] != '\0');
    goto LAB_0046e8fd;
  }
LAB_0046e976:
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue(local_50,(QJsonArray *)&local_b8);
    QVar50.m_data = (char *)0xd;
    QVar50.m_size = (qsizetype)&local_58;
    auVar66 = QJsonObject::operator[](QVar50);
    local_90._0_16_ = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  local_c0 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_c0);
  if (*(long *)(in_RSI + 0xf0) != 0) {
    lVar14 = *(long *)(in_RSI + 0xf0) << 5;
    do {
      builtinObject((BuiltinVariable *)local_90);
      QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
      QJsonArray::append((QJsonValue *)&local_c0);
      QJsonValue::~QJsonValue(local_50);
      QJsonObject::~QJsonObject((QJsonObject *)local_90);
      lVar14 = lVar14 + -0x20;
    } while (lVar14 != 0);
  }
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue(local_50,(QJsonArray *)&local_c0);
    QVar51.m_data = (char *)0xa;
    QVar51.m_size = (qsizetype)&local_58;
    auVar66 = QJsonObject::operator[](QVar51);
    local_90._0_16_ = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_c8);
  if (*(long *)(in_RSI + 0x108) != 0) {
    lVar14 = *(long *)(in_RSI + 0x108) << 5;
    do {
      builtinObject((BuiltinVariable *)local_90);
      QJsonValue::QJsonValue(local_50,(QJsonObject *)local_90);
      QJsonArray::append((QJsonValue *)&local_c8);
      QJsonValue::~QJsonValue(local_50);
      QJsonObject::~QJsonObject((QJsonObject *)local_90);
      lVar14 = lVar14 + -0x20;
    } while (lVar14 != 0);
  }
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue(local_50,(QJsonArray *)&local_c8);
    QVar52.m_data = (char *)0xb;
    QVar52.m_size = (qsizetype)&local_58;
    auVar66 = QJsonObject::operator[](QVar52);
    local_90._0_16_ = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  if (((*(int *)(in_RSI + 0x110) != 0) || (*(int *)(in_RSI + 0x114) != 0)) ||
     (*(int *)(in_RSI + 0x118) != 0)) {
    local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray((QJsonArray *)local_a0);
    lVar14 = 0;
    do {
      QJsonValue::QJsonValue(local_50,*(int *)(in_RSI + 0x110 + lVar14 * 4));
      QJsonArray::append((QJsonValue *)local_a0);
      QJsonValue::~QJsonValue(local_50);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    QJsonValue::QJsonValue(local_50,(QJsonArray *)local_a0);
    QVar53.m_data = (char *)0x10;
    QVar53.m_size = (qsizetype)&local_58;
    auVar66 = QJsonObject::operator[](QVar53);
    local_90._0_16_ = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
    QJsonArray::~QJsonArray((QJsonArray *)local_a0);
  }
  if (*(int *)(in_RSI + 0x11c) != 0) {
    QJsonValue::QJsonValue(local_50,*(int *)(in_RSI + 0x11c));
    QVar54.m_data = (char *)0x1d;
    QVar54.m_size = (qsizetype)&local_58;
    auVar66 = QJsonObject::operator[](QVar54);
    local_90._0_16_ = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  if (*(int *)(in_RSI + 0x120) != 0) {
    lVar13 = 0;
    lVar14 = 0;
LAB_0046eca1:
    if (*(int *)(tessellationModeTab[0].k + lVar14 + 0xc) != *(int *)(in_RSI + 0x120))
    goto code_r0x0046eca7;
    pcVar11 = tessellationModeTab[0].k + lVar14;
    lVar13 = -1;
    pcVar10 = pcVar11;
    do {
      lVar13 = lVar13 + 1;
      cVar3 = *pcVar10;
      pcVar10 = pcVar10 + 1;
    } while (cVar3 != '\0');
    goto LAB_0046ecce;
  }
LAB_0046ed13:
  if (*(int *)(in_RSI + 0x124) != 0) {
    lVar13 = 0;
    lVar14 = 0;
LAB_0046ed28:
    if (*(int *)(tessellationWindingOrderTab[0].k + lVar14 + 8) != *(int *)(in_RSI + 0x124))
    goto code_r0x0046ed2e;
    pcVar11 = tessellationWindingOrderTab[0].k + lVar14;
    lVar13 = -1;
    pcVar10 = pcVar11;
    do {
      lVar13 = lVar13 + 1;
      cVar3 = *pcVar10;
      pcVar10 = pcVar10 + 1;
    } while (cVar3 != '\0');
    goto LAB_0046ed55;
  }
LAB_0046ed9a:
  if (*(int *)(in_RSI + 0x128) != 0) {
    lVar13 = 0;
    lVar14 = 0;
LAB_0046edaf:
    if (*(int *)(tessellationPartitioningTab[0].k + lVar14 + 0x18) != *(int *)(in_RSI + 0x128))
    goto code_r0x0046edb5;
    pcVar11 = tessellationPartitioningTab[0].k + lVar14;
    lVar13 = -1;
    pcVar10 = pcVar11;
    do {
      lVar13 = lVar13 + 1;
      cVar3 = *pcVar10;
      pcVar10 = pcVar10 + 1;
    } while (cVar3 != '\0');
    goto LAB_0046eddc;
  }
LAB_0046ee21:
  local_d0 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_d0);
  if (*(long *)(in_RSI + 0xa8) != 0) {
    pIVar12 = *(InOutVariable **)(in_RSI + 0xa0);
    pIVar15 = pIVar12 + *(long *)(in_RSI + 0xa8);
LAB_0046ee73:
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)&local_d8);
    QVar58.m_data = (storage_type *)(pIVar12->name).d.size;
    QVar58.m_size = (qsizetype)local_90;
    QString::fromUtf8(QVar58);
    QJsonValue::QJsonValue(local_50,(QString *)local_90);
    QVar59.m_data = (char *)0x4;
    QVar59.m_size = (qsizetype)&local_d8;
    auVar66 = QJsonObject::operator[](QVar59);
    local_a0 = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_a0,local_50);
    QJsonValue::~QJsonValue(local_50);
    if ((QArrayData *)local_90._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_90._0_8_,2,0x10);
      }
    }
    lVar14 = 0;
LAB_0046ef00:
    if (*(VariableType *)(typeTab[0].k + lVar14 + 0x14) != pIVar12->type) goto code_r0x0046ef06;
    pcVar10 = typeTab[0].k + lVar14;
    lVar13 = -1;
    do {
      lVar1 = lVar14 + lVar13;
      lVar13 = lVar13 + 1;
    } while (typeTab[0].k[lVar1 + 1] != '\0');
    goto LAB_0046ef31;
  }
LAB_0046efaa:
  cVar3 = QJsonArray::isEmpty();
  if (cVar3 == '\0') {
    QJsonValue::QJsonValue(local_50,(QJsonArray *)&local_d0);
    QVar61.m_data = (char *)0xe;
    QVar61.m_size = (qsizetype)&local_58;
    auVar66 = QJsonObject::operator[](QVar61);
    local_90._0_16_ = auVar66;
    QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
    QJsonValue::~QJsonValue(local_50);
  }
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_d8);
  if (*(long *)(in_RSI + 0xc0) == 0) {
LAB_0046f18b:
    cVar3 = QJsonArray::isEmpty();
    if (cVar3 == '\0') {
      QJsonValue::QJsonValue(local_50,(QJsonArray *)&local_d8);
      QVar65.m_data = (char *)0x10;
      QVar65.m_size = (qsizetype)&local_58;
      auVar66 = QJsonObject::operator[](QVar65);
      local_90._0_16_ = auVar66;
      QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
      QJsonValue::~QJsonValue(local_50);
    }
    QJsonDocument::QJsonDocument((QJsonDocument *)this,(QJsonObject *)&local_58);
    QJsonArray::~QJsonArray((QJsonArray *)&local_d8);
    QJsonArray::~QJsonArray((QJsonArray *)&local_d0);
    QJsonArray::~QJsonArray((QJsonArray *)&local_c8);
    QJsonArray::~QJsonArray((QJsonArray *)&local_c0);
    QJsonArray::~QJsonArray((QJsonArray *)&local_b8);
    QJsonArray::~QJsonArray((QJsonArray *)&local_b0);
    QJsonArray::~QJsonArray((QJsonArray *)&local_a8);
    QJsonArray::~QJsonArray((QJsonArray *)&local_78);
    QJsonArray::~QJsonArray((QJsonArray *)&local_70);
    QJsonArray::~QJsonArray((QJsonArray *)&local_68);
    QJsonArray::~QJsonArray((QJsonArray *)&local_60);
    QJsonObject::~QJsonObject((QJsonObject *)&local_58);
    if (*(BlockVariable **)(in_FS_OFFSET + 0x28) == local_38) {
      return this;
    }
    __stack_chk_fail();
  }
  pIVar12 = *(InOutVariable **)(in_RSI + 0xb8);
  pIVar15 = pIVar12 + *(long *)(in_RSI + 0xc0);
LAB_0046f054:
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)&local_e0);
  QVar62.m_data = (storage_type *)(pIVar12->name).d.size;
  QVar62.m_size = (qsizetype)local_90;
  QString::fromUtf8(QVar62);
  QJsonValue::QJsonValue(local_50,(QString *)local_90);
  QVar63.m_data = (char *)0x4;
  QVar63.m_size = (qsizetype)&local_e0;
  auVar66 = QJsonObject::operator[](QVar63);
  local_a0 = auVar66;
  QJsonValueRef::operator=((QJsonValueRef *)local_a0,local_50);
  QJsonValue::~QJsonValue(local_50);
  if ((QArrayData *)local_90._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_90._0_8_,2,0x10);
    }
  }
  lVar14 = 0;
LAB_0046f0e1:
  if (*(VariableType *)(typeTab[0].k + lVar14 + 0x14) != pIVar12->type) goto code_r0x0046f0e7;
  pcVar10 = typeTab[0].k + lVar14;
  lVar13 = -1;
  do {
    lVar1 = lVar14 + lVar13;
    lVar13 = lVar13 + 1;
  } while (typeTab[0].k[lVar1 + 1] != '\0');
  goto LAB_0046f112;
code_r0x0046e6ed:
  lVar14 = lVar14 + 0x18;
  if (lVar14 == 0x678) goto code_r0x0046e6f9;
  goto LAB_0046e6e7;
code_r0x0046e6f9:
  pcVar10 = (char *)0x0;
  lVar13 = 0;
LAB_0046e718:
  QVar67.m_data = pcVar10;
  QVar67.m_size = lVar13;
  QJsonValue::QJsonValue(local_50,QVar67);
  QVar45.m_data = (char *)0x4;
  QVar45.m_size = (qsizetype)&local_b8;
  auVar66 = QJsonObject::operator[](QVar45);
  local_90._0_16_ = auVar66;
  QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
  QJsonValue::~QJsonValue(local_50);
  addDeco((QJsonObject *)&local_b8,pIVar12);
  QJsonValue::QJsonValue(local_50,(QJsonObject *)&local_b8);
  QJsonArray::append((QJsonValue *)&local_b0);
  QJsonValue::~QJsonValue(local_50);
  QJsonObject::~QJsonObject((QJsonObject *)&local_b8);
  pIVar12 = pIVar12 + 1;
  if (pIVar12 == pIVar15) goto LAB_0046e791;
  goto LAB_0046e65a;
code_r0x0046e8d2:
  lVar14 = lVar14 + 0x18;
  if (lVar14 == 0x678) goto code_r0x0046e8de;
  goto LAB_0046e8cc;
code_r0x0046e8de:
  pcVar10 = (char *)0x0;
  lVar13 = 0;
LAB_0046e8fd:
  QVar68.m_data = pcVar10;
  QVar68.m_size = lVar13;
  QJsonValue::QJsonValue(local_50,QVar68);
  QVar49.m_data = (char *)0x4;
  QVar49.m_size = (qsizetype)&local_c0;
  auVar66 = QJsonObject::operator[](QVar49);
  local_90._0_16_ = auVar66;
  QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
  QJsonValue::~QJsonValue(local_50);
  addDeco((QJsonObject *)&local_c0,pIVar12);
  QJsonValue::QJsonValue(local_50,(QJsonObject *)&local_c0);
  QJsonArray::append((QJsonValue *)&local_b8);
  QJsonValue::~QJsonValue(local_50);
  QJsonObject::~QJsonObject((QJsonObject *)&local_c0);
  pIVar12 = pIVar12 + 1;
  if (pIVar12 == pIVar15) goto LAB_0046e976;
  goto LAB_0046e83f;
code_r0x0046eca7:
  lVar14 = lVar14 + 0x10;
  if (lVar14 == 0x40) goto code_r0x0046ecb1;
  goto LAB_0046eca1;
code_r0x0046ecb1:
  pcVar11 = (char *)0x0;
LAB_0046ecce:
  QVar69.m_data = pcVar11;
  QVar69.m_size = lVar13;
  QJsonValue::QJsonValue(local_50,QVar69);
  QVar55.m_data = (char *)0x10;
  QVar55.m_size = (qsizetype)&local_58;
  auVar66 = QJsonObject::operator[](QVar55);
  local_90._0_16_ = auVar66;
  QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
  QJsonValue::~QJsonValue(local_50);
  goto LAB_0046ed13;
code_r0x0046ed2e:
  lVar14 = lVar14 + 0xc;
  if (lVar14 == 0x24) goto code_r0x0046ed38;
  goto LAB_0046ed28;
code_r0x0046ed38:
  pcVar11 = (char *)0x0;
LAB_0046ed55:
  QVar70.m_data = pcVar11;
  QVar70.m_size = lVar13;
  QJsonValue::QJsonValue(local_50,QVar70);
  QVar56.m_data = (char *)0x18;
  QVar56.m_size = (qsizetype)&local_58;
  auVar66 = QJsonObject::operator[](QVar56);
  local_90._0_16_ = auVar66;
  QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
  QJsonValue::~QJsonValue(local_50);
  goto LAB_0046ed9a;
code_r0x0046edb5:
  lVar14 = lVar14 + 0x1c;
  if (lVar14 == 0x70) goto code_r0x0046edbf;
  goto LAB_0046edaf;
code_r0x0046edbf:
  pcVar11 = (char *)0x0;
LAB_0046eddc:
  QVar71.m_data = pcVar11;
  QVar71.m_size = lVar13;
  QJsonValue::QJsonValue(local_50,QVar71);
  QVar57.m_data = (char *)0x18;
  QVar57.m_size = (qsizetype)&local_58;
  auVar66 = QJsonObject::operator[](QVar57);
  local_90._0_16_ = auVar66;
  QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
  QJsonValue::~QJsonValue(local_50);
  goto LAB_0046ee21;
code_r0x0046ef06:
  lVar14 = lVar14 + 0x18;
  if (lVar14 == 0x678) goto code_r0x0046ef12;
  goto LAB_0046ef00;
code_r0x0046ef12:
  pcVar10 = (char *)0x0;
  lVar13 = 0;
LAB_0046ef31:
  QVar72.m_data = pcVar10;
  QVar72.m_size = lVar13;
  QJsonValue::QJsonValue(local_50,QVar72);
  QVar60.m_data = (char *)0x4;
  QVar60.m_size = (qsizetype)&local_d8;
  auVar66 = QJsonObject::operator[](QVar60);
  local_90._0_16_ = auVar66;
  QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
  QJsonValue::~QJsonValue(local_50);
  addDeco((QJsonObject *)&local_d8,pIVar12);
  QJsonValue::QJsonValue(local_50,(QJsonObject *)&local_d8);
  QJsonArray::append((QJsonValue *)&local_d0);
  QJsonValue::~QJsonValue(local_50);
  QJsonObject::~QJsonObject((QJsonObject *)&local_d8);
  pIVar12 = pIVar12 + 1;
  if (pIVar12 == pIVar15) goto LAB_0046efaa;
  goto LAB_0046ee73;
code_r0x0046f0e7:
  lVar14 = lVar14 + 0x18;
  if (lVar14 == 0x678) goto code_r0x0046f0f3;
  goto LAB_0046f0e1;
code_r0x0046f0f3:
  pcVar10 = (char *)0x0;
  lVar13 = 0;
LAB_0046f112:
  QVar73.m_data = pcVar10;
  QVar73.m_size = lVar13;
  QJsonValue::QJsonValue(local_50,QVar73);
  QVar64.m_data = (char *)0x4;
  QVar64.m_size = (qsizetype)&local_e0;
  auVar66 = QJsonObject::operator[](QVar64);
  local_90._0_16_ = auVar66;
  QJsonValueRef::operator=((QJsonValueRef *)local_90,local_50);
  QJsonValue::~QJsonValue(local_50);
  addDeco((QJsonObject *)&local_e0,pIVar12);
  QJsonValue::QJsonValue(local_50,(QJsonObject *)&local_e0);
  QJsonArray::append((QJsonValue *)&local_d8);
  QJsonValue::~QJsonValue(local_50);
  QJsonObject::~QJsonObject((QJsonObject *)&local_e0);
  pIVar12 = pIVar12 + 1;
  if (pIVar12 == pIVar15) goto LAB_0046f18b;
  goto LAB_0046f054;
}

Assistant:

QJsonDocument QShaderDescriptionPrivate::makeDoc()
{
    QJsonObject root;

    QJsonArray jinputs;
    for (const QShaderDescription::InOutVariable &v : std::as_const(inVars))
        jinputs.append(inOutObject(v));
    if (!jinputs.isEmpty())
        root[inputsKey()] = jinputs;

    QJsonArray joutputs;
    for (const QShaderDescription::InOutVariable &v : std::as_const(outVars))
        joutputs.append(inOutObject(v));
    if (!joutputs.isEmpty())
        root[outputsKey()] = joutputs;

    QJsonArray juniformBlocks;
    for (const QShaderDescription::UniformBlock &b : uniformBlocks) {
        QJsonObject juniformBlock;
        juniformBlock[blockNameKey()] = QString::fromUtf8(b.blockName);
        juniformBlock[structNameKey()] = QString::fromUtf8(b.structName);
        juniformBlock[sizeKey()] = b.size;
        if (b.binding >= 0)
            juniformBlock[bindingKey()] = b.binding;
        if (b.descriptorSet >= 0)
            juniformBlock[setKey()] = b.descriptorSet;
        QJsonArray members;
        for (const QShaderDescription::BlockVariable &v : b.members)
            members.append(blockMemberObject(v));
        juniformBlock[membersKey()] = members;
        juniformBlocks.append(juniformBlock);
    }
    if (!juniformBlocks.isEmpty())
        root[uniformBlocksKey()] = juniformBlocks;

    QJsonArray jpushConstantBlocks;
    for (const QShaderDescription::PushConstantBlock &b : pushConstantBlocks) {
        QJsonObject jpushConstantBlock;
        jpushConstantBlock[nameKey()] = QString::fromUtf8(b.name);
        jpushConstantBlock[sizeKey()] = b.size;
        QJsonArray members;
        for (const QShaderDescription::BlockVariable &v : b.members)
            members.append(blockMemberObject(v));
        jpushConstantBlock[membersKey()] = members;
        jpushConstantBlocks.append(jpushConstantBlock);
    }
    if (!jpushConstantBlocks.isEmpty())
        root[pushConstantBlocksKey()] = jpushConstantBlocks;

    QJsonArray jstorageBlocks;
    for (const QShaderDescription::StorageBlock &b : storageBlocks) {
        QJsonObject jstorageBlock;
        jstorageBlock[blockNameKey()] = QString::fromUtf8(b.blockName);
        jstorageBlock[instanceNameKey()] = QString::fromUtf8(b.instanceName);
        jstorageBlock[knownSizeKey()] = b.knownSize;
        if (b.binding >= 0)
            jstorageBlock[bindingKey()] = b.binding;
        if (b.descriptorSet >= 0)
            jstorageBlock[setKey()] = b.descriptorSet;
        if (b.runtimeArrayStride)
            jstorageBlock[runtimeArrayStrideKey()] = b.runtimeArrayStride;
        if (b.qualifierFlags)
            jstorageBlock[qualifierFlagsKey()] = int(b.qualifierFlags);
        QJsonArray members;
        for (const QShaderDescription::BlockVariable &v : b.members)
            members.append(blockMemberObject(v));
        jstorageBlock[membersKey()] = members;
        jstorageBlocks.append(jstorageBlock);
    }
    if (!jstorageBlocks.isEmpty())
        root[storageBlocksKey()] = jstorageBlocks;

    QJsonArray jcombinedSamplers;
    for (const QShaderDescription::InOutVariable &v : std::as_const(combinedImageSamplers)) {
        QJsonObject sampler;
        sampler[nameKey()] = QString::fromUtf8(v.name);
        sampler[typeKey()] = typeStr(v.type);
        addDeco(&sampler, v);
        jcombinedSamplers.append(sampler);
    }
    if (!jcombinedSamplers.isEmpty())
        root[combinedImageSamplersKey()] = jcombinedSamplers;

    QJsonArray jstorageImages;
    for (const QShaderDescription::InOutVariable &v : std::as_const(storageImages)) {
        QJsonObject image;
        image[nameKey()] = QString::fromUtf8(v.name);
        image[typeKey()] = typeStr(v.type);
        addDeco(&image, v);
        jstorageImages.append(image);
    }
    if (!jstorageImages.isEmpty())
        root[storageImagesKey()] = jstorageImages;

    QJsonArray jinBuiltins;
    for (const QShaderDescription::BuiltinVariable &v : std::as_const(inBuiltins))
        jinBuiltins.append(builtinObject(v));
    if (!jinBuiltins.isEmpty())
        root[inBuiltinsKey()] = jinBuiltins;

    QJsonArray joutBuiltins;
    for (const QShaderDescription::BuiltinVariable &v : std::as_const(outBuiltins))
        joutBuiltins.append(builtinObject(v));
    if (!joutBuiltins.isEmpty())
        root[outBuiltinsKey()] = joutBuiltins;

    if (localSize[0] || localSize[1] || localSize[2]) {
        QJsonArray jlocalSize;
        for (size_t i = 0; i < 3; ++i)
            jlocalSize.append(QJsonValue(int(localSize[i])));
        root[computeLocalSizeKey()] = jlocalSize;
    }

    if (tessOutVertCount)
        root[tessellationOutputVertexCountKey()] = int(tessOutVertCount);

    if (tessMode != QShaderDescription::UnknownTessellationMode)
        root[tessellationModeKey()] = tessModeStr(tessMode);

    if (tessWind != QShaderDescription::UnknownTessellationWindingOrder)
        root[tessellationWindingOrderKey()] = tessWindStr(tessWind);

    if (tessPart != QShaderDescription::UnknownTessellationPartitioning)
        root[tessellationPartitioningKey()] = tessPartStr(tessPart);

    QJsonArray jseparateImages;
    for (const QShaderDescription::InOutVariable &v : std::as_const(separateImages)) {
        QJsonObject image;
        image[nameKey()] = QString::fromUtf8(v.name);
        image[typeKey()] = typeStr(v.type);
        addDeco(&image, v);
        jseparateImages.append(image);
    }
    if (!jseparateImages.isEmpty())
        root[separateImagesKey()] = jseparateImages;

    QJsonArray jseparateSamplers;
    for (const QShaderDescription::InOutVariable &v : std::as_const(separateSamplers)) {
        QJsonObject sampler;
        sampler[nameKey()] = QString::fromUtf8(v.name);
        sampler[typeKey()] = typeStr(v.type);
        addDeco(&sampler, v);
        jseparateSamplers.append(sampler);
    }
    if (!jseparateSamplers.isEmpty())
        root[separateSamplersKey()] = jseparateSamplers;

    return QJsonDocument(root);
}